

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall Assimp::FBXExporter::WriteConnections(FBXExporter *this)

{
  pointer pNVar1;
  Node *n;
  pointer this_00;
  allocator<char> local_e9;
  StreamWriterLE outstream;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_b0;
  Node conn;
  
  if (this->binary == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&conn,"Object connections",(allocator<char> *)&outstream);
    WriteAsciiSectionHeader(this,&conn.name);
    std::__cxx11::string::~string((string *)&conn);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&outstream,"Connections",&local_e9);
  FBX::Node::Node(&conn,(string *)&outstream);
  std::__cxx11::string::~string((string *)&outstream);
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b0,
             &(this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  StreamWriter<false,_false>::StreamWriter
            (&outstream,(shared_ptr<Assimp::IOStream> *)&local_b0,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  FBX::Node::Begin(&conn,&outstream,this->binary,0);
  FBX::Node::BeginChildren(&conn,&outstream,this->binary,0);
  pNVar1 = (this->connections).
           super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->connections).
                 super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pNVar1; this_00 = this_00 + 1) {
    FBX::Node::Dump(this_00,&outstream,this->binary,1);
  }
  FBX::Node::End(&conn,&outstream,this->binary,0,
                 (this->connections).
                 super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 (this->connections).
                 super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::clear(&this->connections);
  StreamWriter<false,_false>::~StreamWriter(&outstream);
  FBX::Node::~Node(&conn);
  return;
}

Assistant:

void FBXExporter::WriteConnections ()
{
    // we should have completed the connection graph already,
    // so basically just dump it here
    if (!binary) {
        WriteAsciiSectionHeader("Object connections");
    }
    // TODO: comments with names in the ascii version
    FBX::Node conn("Connections");
    StreamWriterLE outstream(outfile);
    conn.Begin(outstream, binary, 0);
    conn.BeginChildren(outstream, binary, 0);
    for (auto &n : connections) {
        n.Dump(outstream, binary, 1);
    }
    conn.End(outstream, binary, 0, !connections.empty());
    connections.clear();
}